

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Float pbrt::AngleBetween<float>(Vector3<float> *v1,Vector3<float> *v2)

{
  undefined1 auVar1 [16];
  Vector3<float> *in_RSI;
  Vector3<float> *in_RDI;
  float fVar2;
  undefined1 auVar6 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Vector3<float> VVar7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  undefined1 extraout_var [60];
  
  fVar2 = Dot<float>(in_RDI,in_RSI);
  auVar6 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  if (0.0 <= fVar2) {
    VVar7 = Tuple3<pbrt::Vector3,float>::operator-
                      ((Tuple3<pbrt::Vector3,_float> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (Vector3<float> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    auVar5._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar6;
    vmovlpd_avx(auVar5._0_16_);
    Length<float>((Vector3<float> *)0x480799);
    local_4 = SafeASin(0.0);
    local_4 = local_4 * 2.0;
  }
  else {
    VVar7 = Tuple3<pbrt::Vector3,float>::operator+
                      ((Tuple3<pbrt::Vector3,_float> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (Vector3<float> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    auVar3._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar3._8_56_ = auVar6;
    vmovlpd_avx(auVar3._0_16_);
    Length<float>((Vector3<float> *)0x480732);
    auVar4._0_4_ = SafeASin(0.0);
    auVar4._4_60_ = extraout_var;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar4._0_16_,
                             SUB6416(ZEXT464(0x40490fdb),0));
    local_4 = auVar1._0_4_;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU inline Float AngleBetween(const Vector3<T> &v1, const Vector3<T> &v2) {
    if (Dot(v1, v2) < 0)
        return Pi - 2 * SafeASin(Length(v1 + v2) / 2);
    else
        return 2 * SafeASin(Length(v2 - v1) / 2);
}